

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::Transaction::GetSchnorrSignatureHash
          (ByteData256 *__return_storage_ptr__,Transaction *this,uint32_t txin_index,
          SigHashType *sighash_type,
          vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *utxo_list,
          TapScriptData *script_data,ByteData *annex)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  uint8_t uVar4;
  WitnessVersion WVar5;
  uint32_t uVar6;
  SigHashAlgorithm SVar7;
  size_type sVar8;
  size_type sVar9;
  undefined8 uVar10;
  AbstractTxOut *pAVar11;
  AbstractTxIn *pAVar12;
  int64_t iVar13;
  Amount AVar14;
  undefined7 in_stack_fffffffffffff7d0;
  undefined1 in_stack_fffffffffffff7d7;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  CfdError in_stack_fffffffffffff7ec;
  CfdException *in_stack_fffffffffffff7f0;
  ByteData local_6e0;
  ByteData local_6c8;
  ByteData local_6b0;
  ByteData256 local_698;
  Script local_680;
  ByteData local_648;
  int64_t local_630;
  undefined1 local_628;
  Amount local_620;
  undefined1 local_610 [8];
  Serializer outputs_buf_1;
  Script local_5d0;
  ByteData local_598;
  int64_t local_580;
  undefined1 local_578;
  Amount local_570;
  Txid local_560;
  ByteData local_540;
  uint8_t local_521;
  undefined1 local_520 [7];
  uint8_t spend_type;
  ByteData256 local_508;
  Script local_4f0;
  ByteData local_4b8;
  int64_t local_4a0;
  undefined1 local_498;
  Amount local_490;
  AbstractTxOut *local_480;
  TxOut *txout;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *__range3;
  Serializer outputs_buf;
  ByteData256 local_420;
  ByteData local_408;
  ByteData256 local_3f0;
  ByteData local_3d8;
  ByteData256 local_3c0;
  ByteData local_3a8;
  ByteData256 local_390;
  Script local_378;
  ByteData local_340;
  int64_t local_328;
  undefined1 local_320;
  Amount local_318;
  Txid local_308;
  ByteData local_2e8;
  ulong local_2d0;
  size_t index;
  Serializer sequences_buf;
  Serializer scripts_buf;
  Serializer amounts_buf;
  Serializer prevouts_buf;
  string local_220 [32];
  undefined1 local_200 [8];
  ByteData256 top;
  Serializer builder;
  string local_1b8 [2];
  uint8_t key_version;
  uint8_t has_tap_script;
  uint8_t ext_flag;
  bool has_sighash_all;
  CfdSourceLocation local_198;
  byte local_17c;
  byte local_17b;
  undefined1 local_17a;
  allocator local_179;
  string local_178 [4];
  bool is_anyone_can_pay;
  uint8_t sighash_type_value;
  CfdSourceLocation local_158;
  undefined1 local_13a;
  allocator local_139;
  string local_138 [32];
  CfdSourceLocation local_118;
  undefined1 local_100 [8];
  Script locking_script;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_85;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  TapScriptData *local_38;
  TapScriptData *script_data_local;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *utxo_list_local;
  SigHashType *sighash_type_local;
  Transaction *pTStack_18;
  uint32_t txin_index_local;
  Transaction *this_local;
  
  local_38 = script_data;
  script_data_local = (TapScriptData *)utxo_list;
  utxo_list_local = (vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)sighash_type;
  sighash_type_local._4_4_ = txin_index;
  pTStack_18 = this;
  this_local = (Transaction *)__return_storage_ptr__;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)txin_index,0x32c,"GetSchnorrSignatureHash");
  sVar8 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
  sVar9 = ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::size
                    ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                     script_data_local);
  if (sVar9 < sVar8) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x32e;
    local_50.funcname = "GetSchnorrSignatureHash";
    logger::warn<>(&local_50,"not enough utxo list.");
    local_85 = 1;
    uVar10 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_70,"not enough utxo list.",&local_71);
    CfdException::CfdException
              (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
               (string *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
    local_85 = 0;
    __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar3 = ByteData::IsEmpty(annex);
  if (!bVar3) {
    uVar4 = ByteData::GetHeadData(annex);
    if (uVar4 != 'P') {
      local_a0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                   ,0x2f);
      local_a0.filename = local_a0.filename + 1;
      local_a0.line = 0x332;
      local_a0.funcname = "GetSchnorrSignatureHash";
      logger::warn<>(&local_a0,"invalid annex tag.");
      locking_script.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      uVar10 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_c0,"invalid annex tag",
                 (allocator *)
                 ((long)&locking_script.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      CfdException::CfdException
                (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
                 (string *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
      locking_script.script_stack_.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  pAVar11 = &::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                       ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                        script_data_local,(ulong)sighash_type_local._4_4_)->super_AbstractTxOut;
  AbstractTxOut::GetLockingScript((Script *)local_100,pAVar11);
  bVar3 = Script::IsWitnessProgram((Script *)local_100);
  if (!bVar3) {
    local_118.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_118.filename = local_118.filename + 1;
    local_118.line = 0x338;
    local_118.funcname = "GetSchnorrSignatureHash";
    logger::warn<>(&local_118,"target vin is not segwit.");
    local_13a = 1;
    uVar10 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_138,"target vin is not segwit.",&local_139);
    CfdException::CfdException
              (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
               (string *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
    local_13a = 0;
    __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WVar5 = Script::GetWitnessVersion((Script *)local_100);
  if (WVar5 != kVersion1) {
    local_158.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_158.filename = local_158.filename + 1;
    local_158.line = 0x33b;
    local_158.funcname = "GetSchnorrSignatureHash";
    logger::warn<>(&local_158,"target vin is not segwit v1.");
    local_17a = 1;
    uVar10 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_178,"target vin is not segwit v1.",&local_179);
    CfdException::CfdException
              (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
               (string *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
    local_17a = 0;
    __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  uVar6 = SigHashType::GetSigHashFlag(sighash_type);
  local_17b = (byte)uVar6;
  local_17c = SigHashType::IsAnyoneCanPay(sighash_type);
  bVar3 = SchnorrSignature::IsValidSigHashType(local_17b);
  if (!bVar3) {
    local_198.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_transaction.cpp"
                 ,0x2f);
    local_198.filename = local_198.filename + 1;
    local_198.line = 0x344;
    local_198.funcname = "GetSchnorrSignatureHash";
    logger::warn<>(&local_198,"Invalid sighash type on segwit v1.");
    builder._38_1_ = 1;
    uVar10 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1b8,"Invalid sighash type on segwit v1.",(allocator *)&builder.field_0x27);
    CfdException::CfdException
              (in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,
               (string *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
    builder._38_1_ = 0;
    __cxa_throw(uVar10,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_17b == 0) {
    local_17b = 1;
  }
  builder._37_1_ = -((local_17b & 0xf) == 1) & 1;
  builder._36_1_ = 0;
  builder.offset_._3_1_ = 0;
  builder.offset_._2_1_ = '\0';
  if (local_38 != (TapScriptData *)0x0) {
    bVar3 = ByteData256::IsEmpty(&local_38->tap_leaf_hash);
    if (!bVar3) {
      builder.offset_._3_1_ = 1;
    }
  }
  builder._36_1_ = builder._36_1_ | builder.offset_._3_1_;
  Serializer::Serializer
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_220,"TapSighash",(allocator *)&prevouts_buf.field_0x27);
  HashUtil::Sha256((ByteData256 *)local_200,(string *)local_220);
  ::std::__cxx11::string::~string(local_220);
  ::std::allocator<char>::~allocator((allocator<char> *)&prevouts_buf.field_0x27);
  Serializer::AddDirectBytes
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_200);
  Serializer::AddDirectBytes
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_200);
  Serializer::AddDirectByte
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,'\0');
  uVar6 = SigHashType::GetSigHashFlag(sighash_type);
  Serializer::AddDirectByte
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(uint8_t)uVar6);
  uVar6 = AbstractTransaction::GetVersion(&this->super_AbstractTransaction);
  Serializer::AddDirectNumber
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,uVar6);
  uVar6 = AbstractTransaction::GetLockTime(&this->super_AbstractTransaction);
  Serializer::AddDirectNumber
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,uVar6);
  if ((local_17c & 1) == 0) {
    Serializer::Serializer((Serializer *)&amounts_buf.offset_);
    Serializer::Serializer((Serializer *)&scripts_buf.offset_);
    Serializer::Serializer((Serializer *)&sequences_buf.offset_);
    Serializer::Serializer((Serializer *)&index);
    local_2d0 = 0;
    while( true ) {
      uVar2 = local_2d0;
      sVar8 = ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::size(&this->vin_);
      if (sVar8 <= uVar2) break;
      pAVar12 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                           (&this->vin_,local_2d0)->super_AbstractTxIn;
      AbstractTxIn::GetTxid(&local_308,pAVar12);
      Txid::GetData(&local_2e8,&local_308);
      Serializer::AddDirectBytes((Serializer *)&amounts_buf.offset_,&local_2e8);
      ByteData::~ByteData((ByteData *)0x438dde);
      Txid::~Txid((Txid *)0x438dea);
      pAVar12 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                           (&this->vin_,local_2d0)->super_AbstractTxIn;
      uVar6 = AbstractTxIn::GetVout(pAVar12);
      Serializer::AddDirectNumber((Serializer *)&amounts_buf.offset_,uVar6);
      pAVar11 = &::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                           ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                            script_data_local,local_2d0)->super_AbstractTxOut;
      AVar14 = AbstractTxOut::GetValue(pAVar11);
      local_328 = AVar14.amount_;
      local_320 = AVar14.ignore_check_;
      local_318.amount_ = local_328;
      local_318.ignore_check_ = (bool)local_320;
      iVar13 = Amount::GetSatoshiValue(&local_318);
      Serializer::AddDirectNumber((Serializer *)&scripts_buf.offset_,iVar13);
      pAVar11 = &::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                           ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                            script_data_local,local_2d0)->super_AbstractTxOut;
      AbstractTxOut::GetLockingScript(&local_378,pAVar11);
      Script::GetData(&local_340,&local_378);
      Serializer::AddVariableBuffer((Serializer *)&sequences_buf.offset_,&local_340);
      ByteData::~ByteData((ByteData *)0x438f01);
      Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      pAVar12 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                           (&this->vin_,local_2d0)->super_AbstractTxIn;
      uVar6 = AbstractTxIn::GetSequence(pAVar12);
      Serializer::AddDirectNumber((Serializer *)&index,uVar6);
      local_2d0 = local_2d0 + 1;
    }
    Serializer::Output(&local_3a8,(Serializer *)&amounts_buf.offset_);
    HashUtil::Sha256(&local_390,&local_3a8);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_390);
    ByteData256::~ByteData256((ByteData256 *)0x4390a6);
    ByteData::~ByteData((ByteData *)0x4390b2);
    Serializer::Output(&local_3d8,(Serializer *)&scripts_buf.offset_);
    HashUtil::Sha256(&local_3c0,&local_3d8);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_3c0);
    ByteData256::~ByteData256((ByteData256 *)0x4390fd);
    ByteData::~ByteData((ByteData *)0x439109);
    Serializer::Output(&local_408,(Serializer *)&sequences_buf.offset_);
    HashUtil::Sha256(&local_3f0,&local_408);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_3f0);
    ByteData256::~ByteData256((ByteData256 *)0x439154);
    ByteData::~ByteData((ByteData *)0x439160);
    Serializer::Output((ByteData *)&outputs_buf.offset_,(Serializer *)&index);
    HashUtil::Sha256(&local_420,(ByteData *)&outputs_buf.offset_);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_420);
    ByteData256::~ByteData256((ByteData256 *)0x4391ab);
    ByteData::~ByteData((ByteData *)0x4391b7);
    Serializer::~Serializer((Serializer *)&index);
    Serializer::~Serializer((Serializer *)&sequences_buf.offset_);
    Serializer::~Serializer((Serializer *)&scripts_buf.offset_);
    Serializer::~Serializer((Serializer *)&amounts_buf.offset_);
  }
  if ((builder._37_1_ & 1) != 0) {
    Serializer::Serializer((Serializer *)&__range3);
    __end3 = ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::begin(&this->vout_)
    ;
    txout = (TxOut *)::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::end
                               (&this->vout_);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
                                  *)&txout);
      if (!bVar3) break;
      local_480 = &__gnu_cxx::
                   __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
                   ::operator*(&__end3)->super_AbstractTxOut;
      AVar14 = AbstractTxOut::GetValue(local_480);
      local_4a0 = AVar14.amount_;
      local_498 = AVar14.ignore_check_;
      local_490.amount_ = local_4a0;
      local_490.ignore_check_ = (bool)local_498;
      iVar13 = Amount::GetSatoshiValue(&local_490);
      Serializer::AddDirectNumber((Serializer *)&__range3,iVar13);
      AbstractTxOut::GetLockingScript(&local_4f0,local_480);
      Script::GetData(&local_4b8,&local_4f0);
      Serializer::AddVariableBuffer((Serializer *)&__range3,&local_4b8);
      ByteData::~ByteData((ByteData *)0x439438);
      Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
      __gnu_cxx::
      __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
      ::operator++(&__end3);
    }
    Serializer::Output((ByteData *)local_520,(Serializer *)&__range3);
    HashUtil::Sha256(&local_508,(ByteData *)local_520);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_508);
    ByteData256::~ByteData256((ByteData256 *)0x4394e8);
    ByteData::~ByteData((ByteData *)0x4394f4);
    Serializer::~Serializer((Serializer *)&__range3);
  }
  cVar1 = builder._36_1_ * '\x02';
  bVar3 = ByteData::IsEmpty(annex);
  local_521 = cVar1 + (~bVar3 & 1U);
  Serializer::AddDirectByte
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_521);
  if ((local_17c & 1) == 0) {
    Serializer::AddDirectNumber
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sighash_type_local._4_4_);
  }
  else {
    pAVar12 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                         (&this->vin_,(ulong)sighash_type_local._4_4_)->super_AbstractTxIn;
    AbstractTxIn::GetTxid(&local_560,pAVar12);
    Txid::GetData(&local_540,&local_560);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_540);
    ByteData::~ByteData((ByteData *)0x4395ff);
    Txid::~Txid((Txid *)0x43960b);
    pAVar12 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                         (&this->vin_,(ulong)sighash_type_local._4_4_)->super_AbstractTxIn;
    uVar6 = AbstractTxIn::GetVout(pAVar12);
    Serializer::AddDirectNumber
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,uVar6);
    pAVar11 = &::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                         ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                          script_data_local,(ulong)sighash_type_local._4_4_)->super_AbstractTxOut;
    AVar14 = AbstractTxOut::GetValue(pAVar11);
    local_580 = AVar14.amount_;
    local_578 = AVar14.ignore_check_;
    local_570.amount_ = local_580;
    local_570.ignore_check_ = (bool)local_578;
    iVar13 = Amount::GetSatoshiValue(&local_570);
    Serializer::AddDirectNumber
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,iVar13);
    pAVar11 = &::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                         ((vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *)
                          script_data_local,(ulong)sighash_type_local._4_4_)->super_AbstractTxOut;
    AbstractTxOut::GetLockingScript(&local_5d0,pAVar11);
    Script::GetData(&local_598,&local_5d0);
    Serializer::AddVariableBuffer
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_598);
    ByteData::~ByteData((ByteData *)0x43971c);
    Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    pAVar12 = &::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::operator[]
                         (&this->vin_,(ulong)sighash_type_local._4_4_)->super_AbstractTxIn;
    uVar6 = AbstractTxIn::GetSequence(pAVar12);
    Serializer::AddDirectNumber
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,uVar6);
  }
  bVar3 = ByteData::IsEmpty(annex);
  if (!bVar3) {
    HashUtil::Sha256((ByteData256 *)&outputs_buf_1.offset_,annex);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteData256 *)&outputs_buf_1.offset_);
    ByteData256::~ByteData256((ByteData256 *)0x439837);
  }
  SVar7 = SigHashType::GetSigHashAlgorithm(sighash_type);
  if (SVar7 == kSigHashSingle) {
    (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
              (this,(ulong)sighash_type_local._4_4_,0x389,"GetSchnorrSignatureHash");
    Serializer::Serializer((Serializer *)local_610);
    pAVar11 = &::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                         (&this->vout_,(ulong)sighash_type_local._4_4_)->super_AbstractTxOut;
    AVar14 = AbstractTxOut::GetValue(pAVar11);
    local_630 = AVar14.amount_;
    in_stack_fffffffffffff7d7 = AVar14.ignore_check_;
    local_628 = in_stack_fffffffffffff7d7;
    local_620.amount_ = local_630;
    local_620.ignore_check_ = (bool)in_stack_fffffffffffff7d7;
    iVar13 = Amount::GetSatoshiValue(&local_620);
    Serializer::AddDirectNumber((Serializer *)local_610,iVar13);
    pAVar11 = &::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::operator[]
                         (&this->vout_,(ulong)sighash_type_local._4_4_)->super_AbstractTxOut;
    AbstractTxOut::GetLockingScript(&local_680,pAVar11);
    Script::GetData(&local_648,&local_680);
    Serializer::AddVariableBuffer((Serializer *)local_610,&local_648);
    ByteData::~ByteData((ByteData *)0x43998e);
    Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
    Serializer::Output(&local_6b0,(Serializer *)local_610);
    HashUtil::Sha256(&local_698,&local_6b0);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_698);
    ByteData256::~ByteData256((ByteData256 *)0x4399e5);
    ByteData::~ByteData((ByteData *)0x4399f1);
    Serializer::~Serializer((Serializer *)local_610);
  }
  if (builder.offset_._3_1_ == 1) {
    ByteData256::GetData(&local_6c8,&local_38->tap_leaf_hash);
    Serializer::AddDirectBytes
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_6c8);
    ByteData::~ByteData((ByteData *)0x439ac6);
    Serializer::AddDirectByte
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,builder.offset_._2_1_);
    Serializer::AddDirectNumber
              ((Serializer *)
               &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_38->code_separator_position);
  }
  Serializer::Output(&local_6e0,
                     (Serializer *)
                     &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  HashUtil::Sha256(__return_storage_ptr__,&local_6e0);
  ByteData::~ByteData((ByteData *)0x439b45);
  ByteData256::~ByteData256((ByteData256 *)0x439b51);
  Serializer::~Serializer
            ((Serializer *)
             &top.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Script::~Script((Script *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0));
  return __return_storage_ptr__;
}

Assistant:

ByteData256 Transaction::GetSchnorrSignatureHash(
    uint32_t txin_index, SigHashType sighash_type,
    const std::vector<TxOut> &utxo_list, const TapScriptData *script_data,
    const ByteData &annex) const {
  CheckTxInIndex(txin_index, __LINE__, __FUNCTION__);
  if (this->vin_.size() > utxo_list.size()) {
    warn(CFD_LOG_SOURCE, "not enough utxo list.");
    throw CfdException(kCfdIllegalArgumentError, "not enough utxo list.");
  }
  if ((!annex.IsEmpty()) && (annex.GetHeadData() != TaprootUtil::kAnnexTag)) {
    warn(CFD_LOG_SOURCE, "invalid annex tag.");
    throw CfdException(kCfdIllegalArgumentError, "invalid annex tag");
  }

  const Script locking_script = utxo_list[txin_index].GetLockingScript();
  if (!locking_script.IsWitnessProgram()) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit.");
    throw CfdException(kCfdIllegalArgumentError, "target vin is not segwit.");
  } else if (locking_script.GetWitnessVersion() != WitnessVersion::kVersion1) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "target vin is not segwit v1.");
  }

  uint8_t sighash_type_value =
      static_cast<uint8_t>(sighash_type.GetSigHashFlag());
  bool is_anyone_can_pay = sighash_type.IsAnyoneCanPay();
  if (!SchnorrSignature::IsValidSigHashType(sighash_type_value)) {
    warn(CFD_LOG_SOURCE, "Invalid sighash type on segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "Invalid sighash type on segwit v1.");
  } else if (sighash_type_value == 0) {
    sighash_type_value = 0x01;  // SIGHASH_ALL
  }
  bool has_sighash_all = ((sighash_type_value & 0x0f) == 1) ? true : false;

  uint8_t ext_flag = 0;  // 0 - 127
  uint8_t has_tap_script = 0;
  uint8_t key_version = 0;
  if ((script_data != nullptr) && (!script_data->tap_leaf_hash.IsEmpty())) {
    has_tap_script = 1;
  }
  ext_flag |= has_tap_script;

  Serializer builder;
  auto top = HashUtil::Sha256("TapSighash");
  builder.AddDirectBytes(top);
  builder.AddDirectBytes(top);  // double data
  builder.AddDirectByte(0);     // EPOCH
  builder.AddDirectByte(static_cast<uint8_t>(sighash_type.GetSigHashFlag()));
  builder.AddDirectNumber(static_cast<uint32_t>(GetVersion()));
  builder.AddDirectNumber(GetLockTime());
  if (!is_anyone_can_pay) {
    Serializer prevouts_buf;
    Serializer amounts_buf;
    Serializer scripts_buf;
    Serializer sequences_buf;
    for (size_t index = 0; index < vin_.size(); ++index) {
      prevouts_buf.AddDirectBytes(vin_[index].GetTxid().GetData());
      prevouts_buf.AddDirectNumber(vin_[index].GetVout());
      amounts_buf.AddDirectNumber(
          utxo_list[index].GetValue().GetSatoshiValue());
      scripts_buf.AddVariableBuffer(
          utxo_list[index].GetLockingScript().GetData());
      sequences_buf.AddDirectNumber(vin_[index].GetSequence());
    }
    builder.AddDirectBytes(HashUtil::Sha256(prevouts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(amounts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(scripts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(sequences_buf.Output()));
  }
  if (has_sighash_all) {
    Serializer outputs_buf;
    for (const auto &txout : vout_) {
      outputs_buf.AddDirectNumber(txout.GetValue().GetSatoshiValue());
      outputs_buf.AddVariableBuffer(txout.GetLockingScript().GetData());
    }
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  uint8_t spend_type = (ext_flag << 1) + (annex.IsEmpty() ? 0 : 1);
  builder.AddDirectByte(spend_type);
  if (is_anyone_can_pay) {
    builder.AddDirectBytes(vin_[txin_index].GetTxid().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetVout());
    builder.AddDirectNumber(
        utxo_list[txin_index].GetValue().GetSatoshiValue());
    builder.AddVariableBuffer(
        utxo_list[txin_index].GetLockingScript().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetSequence());
  } else {
    builder.AddDirectNumber(txin_index);
  }

  if (!annex.IsEmpty()) builder.AddDirectBytes(HashUtil::Sha256(annex));

  if (sighash_type.GetSigHashAlgorithm() == SigHashAlgorithm::kSigHashSingle) {
    CheckTxOutIndex(txin_index, __LINE__, __FUNCTION__);
    Serializer outputs_buf;
    outputs_buf.AddDirectNumber(
        vout_[txin_index].GetValue().GetSatoshiValue());
    outputs_buf.AddVariableBuffer(
        vout_[txin_index].GetLockingScript().GetData());
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  if (has_tap_script == 1) {
    builder.AddDirectBytes(script_data->tap_leaf_hash.GetData());
    builder.AddDirectByte(key_version);
    builder.AddDirectNumber(script_data->code_separator_position);
  }
  return HashUtil::Sha256(builder.Output());
}